

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.h
# Opt level: O0

shared_ptr<ListNodes<int_*>_> __thiscall Lists<int_*>::head(Lists<int_*> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ListNodes<int_*>_> *in_RSI;
  shared_ptr<ListNodes<int_*>_> sVar1;
  Lists<int_*> *this_local;
  
  std::shared_ptr<ListNodes<int_*>_>::shared_ptr(&this->theHead,in_RSI);
  sVar1.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ListNodes<int_*>_>)
         sVar1.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ListNodes<T>> head() {
        return theHead;
    }